

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::anon_unknown_0::LineCase::LineCase
          (LineCase *this,Context *context,char *name,char *description,
          ColorlessLineData *linesBegin,ColorlessLineData *linesEnd,float lineWidth,
          WindowRectangle *viewport,int searchKernelSize)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  pointer pCVar5;
  pointer pCVar6;
  ulong uVar7;
  long lVar8;
  ColoredLineData *extraout_RDX;
  ColoredLineData *extraout_RDX_00;
  ColoredLineData *__args;
  ColoredLineData *extraout_RDX_01;
  ColoredLineData *extraout_RDX_02;
  ColoredLineData *__args_00;
  TestContext *pTVar9;
  pointer pCVar10;
  TestContext *testCtx;
  pointer pCVar11;
  pointer pCVar12;
  _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
  *this_00;
  Platform *local_78;
  Archive *pAStack_70;
  TestLog *local_68;
  CommandLine *pCStack_60;
  qpWatchDog *local_58;
  Archive *pAStack_50;
  undefined8 local_48;
  _Alloc_hider _Stack_40;
  
  testCtx = context->m_testCtx;
  tcu::TestCase::TestCase((TestCase *)this,testCtx,name,description);
  (this->super_LineRenderTestCase).super_RenderTestCase.super_TestCase.m_context = context;
  (this->super_LineRenderTestCase).super_RenderTestCase.super_TestCase.super_TestCase.super_TestNode
  ._vptr_TestNode = (_func_int **)&PTR__LineRenderTestCase_02145a88;
  (this->super_LineRenderTestCase).m_lineWidth = lineWidth;
  (this->super_LineRenderTestCase).m_lines.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_LineRenderTestCase).m_lines.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_LineRenderTestCase).m_lines.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (linesBegin != linesEnd) {
    pCVar10 = (pointer)0x0;
    pCVar11 = (pointer)0x0;
    __args_00 = extraout_RDX;
    pCVar12 = (pointer)0x0;
    do {
      local_78 = *(Platform **)(linesBegin->p0).m_data;
      pAStack_70 = *(Archive **)((linesBegin->p0).m_data + 2);
      local_68 = (TestLog *)0x3f8000003f800000;
      pCStack_60 = (CommandLine *)0x3f8000003f800000;
      local_58 = *(qpWatchDog **)(linesBegin->p1).m_data;
      pAStack_50 = *(Archive **)((linesBegin->p1).m_data + 2);
      local_48._0_4_ = 0x3f800000;
      local_48._4_4_ = 0x3f800000;
      _Stack_40._M_p = (pointer)0x3f8000003f800000;
      if (pCVar11 == pCVar10) {
        pTVar9 = (TestContext *)((long)pCVar10 - (long)pCVar12);
        if (pTVar9 == (TestContext *)0x7fffffffffffffc0) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar4 = (long)pTVar9 >> 6;
        uVar7 = uVar4;
        if (pCVar10 == pCVar12) {
          uVar7 = 1;
        }
        this_00 = (_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
                   *)(uVar7 + uVar4);
        if ((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
             *)0x1fffffffffffffe < this_00) {
          this_00 = (_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
                     *)0x1ffffffffffffff;
        }
        if (CARRY8(uVar7,uVar4)) {
          this_00 = (_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
                     *)0x1ffffffffffffff;
        }
        pCVar5 = std::
                 _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
                 ::_M_allocate(this_00,(size_t)testCtx);
        testCtx = (TestContext *)&local_78;
        std::
        allocator_traits<std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>>
        ::
        construct<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData_const&>
                  ((allocator_type *)((long)pCVar5 + (long)pTVar9),(ColoredLineData *)testCtx,__args
                  );
        pCVar11 = pCVar5;
        for (pCVar6 = pCVar12; pCVar10 != pCVar6; pCVar6 = pCVar6 + 1) {
          lVar8 = 0;
          do {
            (pCVar11->p0).m_data[lVar8] = (pCVar6->p0).m_data[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar8 != 4);
          lVar8 = 4;
          do {
            (pCVar11->p0).m_data[lVar8] = (pCVar6->p0).m_data[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar8 != 8);
          lVar8 = 8;
          do {
            (pCVar11->p0).m_data[lVar8] = (pCVar6->p0).m_data[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar8 != 0xc);
          lVar8 = 0xc;
          do {
            (pCVar11->p0).m_data[lVar8] = (pCVar6->p0).m_data[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar8 != 0x10);
          pCVar11 = pCVar11 + 1;
        }
        __args_00 = extraout_RDX_01;
        if (pCVar12 != (pointer)0x0) {
          operator_delete(pCVar12,(ulong)pTVar9);
          __args_00 = extraout_RDX_02;
          testCtx = pTVar9;
        }
        pCVar11 = pCVar11 + 1;
        (this->super_LineRenderTestCase).m_lines.
        super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
        ._M_impl.super__Vector_impl_data._M_start = pCVar5;
        (this->super_LineRenderTestCase).m_lines.
        super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
        ._M_impl.super__Vector_impl_data._M_finish = pCVar11;
        pCVar10 = pCVar5 + (long)this_00;
        (this->super_LineRenderTestCase).m_lines.
        super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pCVar10;
      }
      else {
        testCtx = (TestContext *)&local_78;
        std::
        allocator_traits<std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>>
        ::
        construct<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData_const&>
                  ((allocator_type *)pCVar11,(ColoredLineData *)testCtx,__args_00);
        pCVar11 = pCVar11 + 1;
        (this->super_LineRenderTestCase).m_lines.
        super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
        ._M_impl.super__Vector_impl_data._M_finish = pCVar11;
        __args_00 = extraout_RDX_00;
        pCVar5 = pCVar12;
      }
      linesBegin = linesBegin + 1;
      pCVar12 = pCVar5;
    } while (linesBegin != linesEnd);
  }
  iVar1 = viewport->bottom;
  iVar2 = viewport->width;
  iVar3 = viewport->height;
  (this->super_LineRenderTestCase).m_viewport.left = viewport->left;
  (this->super_LineRenderTestCase).m_viewport.bottom = iVar1;
  (this->super_LineRenderTestCase).m_viewport.width = iVar2;
  (this->super_LineRenderTestCase).m_viewport.height = iVar3;
  (this->super_LineRenderTestCase).super_RenderTestCase.super_TestCase.super_TestCase.super_TestNode
  ._vptr_TestNode = (_func_int **)&PTR__LineRenderTestCase_02145a10;
  this->m_searchKernelSize = searchKernelSize;
  return;
}

Assistant:

LineCase::LineCase (Context& context, const char* name, const char* description, const LineRenderTestCase::ColorlessLineData* linesBegin, const LineRenderTestCase::ColorlessLineData* linesEnd, float lineWidth, const rr::WindowRectangle& viewport, int searchKernelSize)
	: LineRenderTestCase	(context, name, description, linesBegin, linesEnd, lineWidth, viewport)
	, m_searchKernelSize	(searchKernelSize)
{
}